

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.hh
# Opt level: O0

void __thiscall tinyusdz::crate::CrateReader::Node::Node(Node *this)

{
  Node *this_local;
  
  this->_parent = -2;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_children);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->_primChildren);
  Path::Path(&this->_path);
  Path::Path(&this->_elemPath);
  return;
}

Assistant:

Node() : _parent(-2) {}